

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O1

int getBiomeAt(Generator *g,int scale,int x,int y,int z)

{
  Range r_00;
  int iVar1;
  size_t __nmemb;
  int *cache;
  int iVar2;
  Range r;
  
  __nmemb = getMinCacheSize(g,scale,1,1,1);
  if (__nmemb == 0) {
    cache = (int *)0x0;
  }
  else {
    cache = (int *)calloc(__nmemb,4);
  }
  r_00.x = x;
  r_00.scale = scale;
  r_00.sy = 1;
  r_00.y = y;
  r_00.z = z;
  r_00.sx = 1;
  r_00.sz = 1;
  iVar1 = genBiomes(g,cache,r_00);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = *cache;
  }
  free(cache);
  return iVar2;
}

Assistant:

int getBiomeAt(const Generator *g, int scale, int x, int y, int z)
{
    Range r = {scale, x, z, 1, 1, y, 1};
    int *ids = allocCache(g, r);
    int id = genBiomes(g, ids, r);
    if (id == 0)
        id = ids[0];
    else
        id = none;
    free(ids);
    return id;
}